

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

Status __thiscall CFG::check(CFG *this)

{
  CfgNode *pCVar1;
  CfgNode *pCVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  
  this->m_status = INVALID;
  pCVar1 = this->m_exitNode;
  pCVar2 = this->m_haltNode;
  if (((((pCVar1 != (CfgNode *)0x0 || pCVar2 != (CfgNode *)0x0) &&
        ((this->m_entryNode->m_preds)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
       ((this->m_entryNode->m_succs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
      ((pCVar1 == (CfgNode *)0x0 ||
       (((pCVar1->m_succs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
        ((pCVar1->m_preds)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)))))) &&
     ((pCVar2 == (CfgNode *)0x0 ||
      (((pCVar2->m_succs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
       ((pCVar2->m_preds)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)))))) {
    for (p_Var4 = (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar5 = (_Rb_tree_header *)p_Var4 != &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header,
        bVar5; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      p_Var3 = p_Var4[1]._M_parent;
      if (p_Var3 == (_Base_ptr)0x0) {
        __assert_fail("node != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0xf5,"enum CFG::Status CFG::check()");
      }
      if ((p_Var3[3]._M_left == (_Base_ptr)0x0) ||
         ((*(int *)&p_Var3->_M_parent != 2 && (*(long *)(p_Var3 + 2) == 0)))) {
        if (bVar5) goto LAB_00104f3d;
        break;
      }
    }
    this->m_status = VALID;
  }
LAB_00104f3d:
  return this->m_status;
}

Assistant:

enum CFG::Status CFG::check() {
	m_status = CFG::INVALID;

	if (!m_exitNode && !m_haltNode)
		goto out;

	if (m_entryNode->hasPredecessor() || !m_entryNode->hasSuccessors() ||
		(m_exitNode && (m_exitNode->hasSuccessors() || !m_exitNode->hasPredecessor())) ||
		(m_haltNode && (m_haltNode->hasSuccessors() || !m_haltNode->hasPredecessor())))
		goto out;

	for (std::map<Addr, CfgNode*>::iterator it = m_nodesMap.begin(),
			ed = m_nodesMap.end(); it != ed; it++) {
		CfgNode* node = it->second;
		assert(node != 0);

		if (!node->hasPredecessor() ||
			(node->type() != CfgNode::CFG_PHANTOM && !node->hasSuccessors()))
			goto out;
	}

	m_status = CFG::VALID;

out:
	return m_status;
}